

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  long lVar1;
  cmSourceFile *pcVar2;
  cmake *this_00;
  pointer ppcVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  string *psVar7;
  cmCustomCommand *pcVar8;
  ostream *poVar9;
  cmSourceFileLocation *pcVar10;
  pointer ppcVar11;
  uint uVar12;
  cmGlobalGenerator *sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar13;
  cmSourceFile *sf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  cmSourceFile *local_320;
  undefined1 local_318 [32];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_2f8;
  cmGeneratorTarget *local_2d8;
  undefined1 local_2d0 [24];
  cmGlobalGenerator *local_2b8;
  undefined1 local_2a8 [8];
  _Rb_tree_node_base local_2a0;
  _Base_ptr local_280;
  undefined1 local_278 [16];
  _Rb_tree_node_base local_268 [3];
  ios_base local_208 [264];
  RegularExpression local_100;
  
  local_2d8 = (cmGeneratorTarget *)files;
  GetSourceFilePaths((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_2d0 + 0x10),this,config);
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  cmsys::RegularExpression::compile(&local_100,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (cmSourceFile **)0x0;
  local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmSourceFile **)0x0;
  local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (cmSourceFile **)0x0;
  local_2a0._M_left = &local_2a0;
  local_2a0._M_color = _S_red;
  local_2a0._M_parent = (_Base_ptr)0x0;
  local_280 = (_Base_ptr)0x0;
  local_2a0._M_right = local_2a0._M_left;
  if ((cmGlobalGenerator *)local_2d0._16_8_ != local_2b8) {
    sourceName = (cmGlobalGenerator *)local_2d0._16_8_;
    do {
      local_320 = cmMakefile::GetOrCreateSource(this->Makefile,(string *)sourceName,false,Ambiguous)
      ;
      pVar13 = std::
               _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               ::_M_insert_unique<cmSourceFile*const&>
                         ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                           *)local_2a8,&local_320);
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar7 = cmSourceFile::GetExtension_abi_cxx11_(local_320);
        cmsys::SystemTools::LowerCase((string *)local_278,psVar7);
        pcVar8 = cmSourceFile::GetCustomCommand(local_320);
        uVar12 = 2;
        if (pcVar8 == (cmCustomCommand *)0x0) {
          TVar5 = cmTarget::GetType(this->Target);
          uVar12 = 4;
          if ((TVar5 != UTILITY) &&
             (TVar5 = cmTarget::GetType(this->Target), TVar5 != INTERFACE_LIBRARY)) {
            psVar7 = cmSourceFile::ResolveFullPath(local_320,(string *)0x0,(string *)0x0);
            bVar4 = IsSourceFilePartOfUnityBatch(this,psVar7);
            pcVar2 = local_320;
            uVar12 = 0xc;
            if (!bVar4) {
              local_318._0_8_ = local_318 + 0x10;
              local_2d0._0_8_ = (element_type *)0x10;
              local_318._0_8_ = std::__cxx11::string::_M_create((ulong *)local_318,(ulong)local_2d0)
              ;
              local_318._16_7_ = (undefined7)local_2d0._0_8_;
              local_318[0x17] = SUB81(local_2d0._0_8_,7);
              builtin_strncpy((char *)local_318._0_8_,"HEADER_FILE_ONLY",0x10);
              local_318._8_8_ = local_2d0._0_8_;
              *(char *)(local_318._0_8_ + local_2d0._0_8_) = '\0';
              bVar4 = cmSourceFile::GetPropertyAsBool(pcVar2,(string *)local_318);
              if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
                operator_delete((void *)local_318._0_8_,
                                CONCAT17(local_318[0x17],local_318._16_7_) + 1);
              }
              uVar12 = 5;
              if (!bVar4) {
                local_318._24_4_ = 0x4a424f5f;
                local_318._28_3_ = 0x544345;
                local_318._16_7_ = 0x414e5245545845;
                local_318[0x17] = 'L';
                local_318._8_8_ = (element_type *)0xf;
                local_318[0x1f] = '\0';
                local_318._0_8_ = local_318 + 0x10;
                bVar4 = cmSourceFile::GetPropertyAsBool(local_320,(string *)local_318);
                if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
                  operator_delete((void *)local_318._0_8_,
                                  CONCAT17(local_318[0x17],local_318._16_7_) + 1);
                }
                uVar12 = 3;
                if (!bVar4) {
                  psVar7 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(local_320);
                  uVar12 = 9;
                  if (psVar7->_M_string_length == 0) {
                    iVar6 = std::__cxx11::string::compare(local_278);
                    if (iVar6 == 0) {
                      TVar5 = cmTarget::GetType(this->Target);
                      uVar12 = 8;
                      if (TVar5 == OBJECT_LIBRARY) {
                        if (local_2f8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_2f8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                          _M_realloc_insert<cmSourceFile*const&>
                                    ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                                     &local_2f8,
                                     (iterator)
                                     local_2f8.
                                     super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_320);
                        }
                        else {
                          *local_2f8.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish = local_320;
                          local_2f8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_2f8.
                               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                      }
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare(local_278);
                      if (iVar6 == 0) {
                        TVar5 = cmTarget::GetType(this->Target);
                        uVar12 = 6;
                        if (TVar5 == OBJECT_LIBRARY) {
                          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                    (&local_2f8,&local_320);
                        }
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare(local_278);
                        if (iVar6 == 0) {
                          uVar12 = 10;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare(local_278);
                          if (iVar6 == 0) {
                            uVar12 = 0;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare(local_278);
                            pcVar2 = local_320;
                            if (iVar6 == 0) {
                              local_318._0_8_ = local_318 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_318,"VS_DEPLOYMENT_CONTENT","");
                              bVar4 = cmSourceFile::GetPropertyAsBool(pcVar2,(string *)local_318);
                              if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
                                operator_delete((void *)local_318._0_8_,
                                                CONCAT17(local_318[0x17],local_318._16_7_) + 1);
                              }
                              uVar12 = (uint)!bVar4 + (uint)!bVar4 * 2 + 4;
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare(local_278);
                              if (iVar6 == 0) {
                                uVar12 = 1;
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare(local_278);
                                if (iVar6 == 0) {
                                  uVar12 = 0xb;
                                }
                                else {
                                  psVar7 = cmSourceFile::ResolveFullPath
                                                     (local_320,(string *)0x0,(string *)0x0);
                                  bVar4 = cmsys::RegularExpression::find
                                                    (&local_100,(psVar7->_M_dataplus)._M_p,
                                                     &local_100.regmatch);
                                  uVar12 = bVar4 | 4;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_318._8_8_ =
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&sourceName->MakeSilentFlag)[1]._M_allocated_capacity;
        lVar1 = *(long *)((long)&sourceName->MakeSilentFlag + 0x18);
        if (lVar1 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
          }
        }
        local_318._0_8_ = local_320;
        local_318._16_7_ = (undefined7)lVar1;
        local_318[0x17] = (undefined1)((ulong)lVar1 >> 0x38);
        local_318._24_4_ = uVar12;
        std::
        vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
        ::emplace_back<cmGeneratorTarget::SourceAndKind>
                  ((vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                    *)local_2d8,(SourceAndKind *)local_318);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT17(local_318[0x17],local_318._16_7_) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT17(local_318[0x17],local_318._16_7_));
        }
        if ((_Rb_tree_node_base *)local_278._0_8_ != local_268) {
          operator_delete((void *)local_278._0_8_,local_268[0]._0_8_ + 1);
        }
      }
      sourceName = (cmGlobalGenerator *)&sourceName->RecursionDepth;
    } while (sourceName != local_2b8);
  }
  if (local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"OBJECT library \"",0x10);
    psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" contains:\n",0xc);
    ppcVar3 = local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_2d8 = this;
    if (local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppcVar11 = local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar2 = *ppcVar11;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ",2);
        pcVar10 = cmSourceFile::GetLocation(pcVar2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,(pcVar10->Name)._M_dataplus._M_p,
                            (pcVar10->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        ppcVar11 = ppcVar11 + 1;
      } while (ppcVar11 != ppcVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
               ,0x7b);
    this_00 = local_2d8->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_2d0);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_318,(cmListFileBacktrace *)local_2d0);
    if ((cmMakefile *)local_2d0._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0._8_8_);
    }
    if ((cmSourceFile *)local_318._0_8_ != (cmSourceFile *)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,CONCAT17(local_318[0x17],local_318._16_7_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    std::ios_base::~ios_base(local_208);
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree((_Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
               *)local_2a8);
  if (local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (cmSourceFile **)0x0) {
    operator_delete(local_2f8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_2d0 + 0x10));
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY ||
               this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY
               // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
               // NOLINTNEXTLINE(bugprone-branch-clone)
    ) {
      kind = SourceKindExtra;
    } else if (this->IsSourceFilePartOfUnityBatch(sf->ResolveFullPath())) {
      kind = SourceKindUnityBatched;
      // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
      // NOLINTNEXTLINE(bugprone-branch-clone)
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetOrDetermineLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      if (sf->GetPropertyAsBool("VS_DEPLOYMENT_CONTENT")) {
        kind = SourceKindExtra;
      } else {
        kind = SourceKindManifest;
      }
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
    } else if (header_regex.find(sf->ResolveFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}